

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

int libj1939_ifindex(char *str)

{
  uint uVar1;
  if_nameindex *piVar2;
  int iVar3;
  char *in_RAX;
  long lVar4;
  char *extraout_RAX;
  if_nameindex *piVar5;
  char *endp;
  char *local_28 [5];
  
  while( true ) {
    piVar2 = saved;
    local_28[0] = in_RAX;
    lVar4 = strtol(str,local_28,0);
    if (*local_28[0] == '\0') {
      return (int)lVar4;
    }
    fetch_names();
    piVar5 = saved;
    while (uVar1 = piVar5->if_index, uVar1 != 0) {
      iVar3 = strcmp(piVar5->if_name,str);
      piVar5 = piVar5 + 1;
      if (iVar3 == 0) {
        return uVar1;
      }
    }
    if (piVar2 == (if_nameindex *)0x0) break;
    libj1939_cleanup();
    in_RAX = extraout_RAX;
  }
  return 0;
}

Assistant:

static int libj1939_ifindex(const char *str)
{
	const struct if_nameindex *lp, *cached = saved;
	char *endp;
	int ret;

	ret = strtol(str, &endp, 0);
	if (!*endp)
		/* did some good parse */
		return ret;

	fetch_names();
	for (lp = saved; lp->if_index; ++lp) {
		if (!strcmp(lp->if_name, str))
			return lp->if_index;
	}
	if (cached) {
		libj1939_cleanup();
		return libj1939_ifindex(str);
	}
	return 0;
}